

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O3

void __thiscall
flow::diagnostics::Report::syntaxError<flow::lang::Token,flow::lang::Token>
          (Report *this,SourceLocation *sloc,string *f,Token args,Token args_1)

{
  pointer pcVar1;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  Token local_2c8;
  Token local_2c4;
  string local_2c0;
  SourceLocation local_2a0;
  Token *local_268;
  code *local_260;
  undefined1 *local_258;
  code *local_250;
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  local_2a0.filename._M_dataplus._M_p = (pointer)&local_2a0.filename.field_2;
  pcVar1 = (sloc->filename)._M_dataplus._M_p;
  local_2c8 = args_1;
  local_2c4 = args;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,pcVar1,pcVar1 + (sloc->filename)._M_string_length);
  local_2a0.end.column = (sloc->end).column;
  local_2a0.end.offset = (sloc->end).offset;
  local_2a0.begin.line = (sloc->begin).line;
  local_2a0.begin.column = (sloc->begin).column;
  local_2a0._40_8_ = *(undefined8 *)&(sloc->begin).offset;
  format_str.data_ = (f->_M_dataplus)._M_p;
  format_str.size_ = f->_M_string_length;
  local_260 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::lang::Token>;
  local_250 = fmt::v5::internal::
              value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ::format_custom_arg<flow::lang::Token>;
  local_238 = 0;
  local_248 = &PTR_grow_0019b370;
  local_230 = 500;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_268;
  args_00.types_ = 0xdd;
  local_268 = &local_2c4;
  local_258 = (undefined1 *)&local_2c8;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args_00);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,local_240,local_240 + local_238);
  local_248 = &PTR_grow_0019b370;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  emplace_back(this,SyntaxError,&local_2a0,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.filename._M_dataplus._M_p != &local_2a0.filename.field_2) {
    operator_delete(local_2a0.filename._M_dataplus._M_p,
                    local_2a0.filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void syntaxError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::SyntaxError, sloc, fmt::format(f, std::move(args)...));
  }